

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void pile_insert(object **pile,object *obj)

{
  wchar_t in_ECX;
  object *in_RDX;
  object *extraout_RDX;
  object *poVar1;
  
  poVar1 = obj;
  if ((obj->prev != (object *)0x0) || (obj->next != (object *)0x0)) {
    pile_integrity_fail((object *)0x0,obj,(char *)0xaa,in_ECX);
    in_RDX = extraout_RDX;
  }
  if (*pile != (object *)0x0) {
    obj->next = *pile;
    (*pile)->prev = obj;
  }
  *pile = obj;
  pile_check_integrity((char *)obj,poVar1,in_RDX);
  return;
}

Assistant:

void pile_insert(struct object **pile, struct object *obj)
{
	if (obj->prev || obj->next) {
		pile_integrity_fail(NULL, obj, __FILE__, __LINE__);
	}

	if (*pile) {
		obj->next = *pile;
		(*pile)->prev = obj;
	}

	*pile = obj;

	pile_check_integrity("insert", *pile, obj);
}